

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamMultiReaderPrivate::Jump(BamMultiReaderPrivate *this,int refID,int position)

{
  pointer pMVar1;
  bool bVar2;
  MergeItem *item;
  pointer pMVar3;
  
  pMVar1 = (this->m_readers).
           super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (this->m_readers).
                super__Vector_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    if (pMVar3->Reader != (BamReader *)0x0) {
      BamReader::Jump(pMVar3->Reader,refID,position);
    }
  }
  bVar2 = UpdateAlignmentCache(this);
  return bVar2;
}

Assistant:

bool BamMultiReaderPrivate::Jump(int refID, int position)
{

    // NB: While it may make sense to track readers in which we can
    // successfully Jump, in practice a failure of Jump means "no
    // alignments here."  It makes sense to simply accept the failure,
    // UpdateAlignments(), and continue.

    // iterate over readers
    std::vector<MergeItem>::iterator readerIter = m_readers.begin();
    std::vector<MergeItem>::iterator readerEnd = m_readers.end();
    for (; readerIter != readerEnd; ++readerIter) {
        MergeItem& item = (*readerIter);
        BamReader* reader = item.Reader;
        if (reader == 0) {
            continue;
        }

        // jump in each BamReader to position of interest
        reader->Jump(refID, position);
    }

    // returns status of cache update
    return UpdateAlignmentCache();
}